

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O1

void Fra_ObjAddToFrontier(Fra_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  uint uVar1;
  long lVar2;
  void **ppvVar3;
  int iVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCnf.c"
                  ,0xd7,"void Fra_ObjAddToFrontier(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  lVar2 = (long)pObj->Id;
  if (*(int *)(*(long *)((long)(pObj->field_5).pData + 0x98) + lVar2 * 4) != 0) {
    return;
  }
  if (*(long *)(*(long *)((long)(pObj->field_5).pData + 0x90) + lVar2 * 8) != 0) {
    __assert_fail("Fra_ObjFaninVec(pObj) == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCnf.c"
                  ,0xdb,"void Fra_ObjAddToFrontier(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 1) {
    return;
  }
  iVar4 = p->nSatVars;
  p->nSatVars = iVar4 + 1;
  *(int *)(*(long *)((long)(pObj->field_5).pData + 0x98) + lVar2 * 4) = iVar4;
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    return;
  }
  uVar1 = vFrontier->nCap;
  if (vFrontier->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vFrontier->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vFrontier->pArray,0x80);
      }
      vFrontier->pArray = ppvVar3;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_005f8535;
      if (vFrontier->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vFrontier->pArray,(ulong)uVar1 << 4);
      }
      vFrontier->pArray = ppvVar3;
    }
    vFrontier->nCap = iVar4;
  }
LAB_005f8535:
  iVar4 = vFrontier->nSize;
  vFrontier->nSize = iVar4 + 1;
  vFrontier->pArray[iVar4] = pObj;
  return;
}

Assistant:

void Fra_ObjAddToFrontier( Fra_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Fra_ObjSatNum(pObj) )
        return;
    assert( Fra_ObjSatNum(pObj) == 0 );
    assert( Fra_ObjFaninVec(pObj) == NULL );
    if ( Aig_ObjIsConst1(pObj) )
        return;
    Fra_ObjSetSatNum( pObj, p->nSatVars++ );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}